

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O3

void INT_CMregister_non_CM_message_handler(int header,CMNonCMHandler handler)

{
  handler_list pfVar1;
  
  if (foreign_handler_count < 1) {
    pfVar1 = (handler_list)INT_CMmalloc(0x10);
  }
  else {
    pfVar1 = (handler_list)
             INT_CMrealloc(foreign_handler_list,(ulong)(uint)foreign_handler_count * 0x10 + 0x10);
  }
  foreign_handler_list = pfVar1;
  pfVar1[foreign_handler_count].header = header;
  pfVar1[foreign_handler_count].handler = handler;
  foreign_handler_count = foreign_handler_count + 1;
  return;
}

Assistant:

extern void
 INT_CMregister_non_CM_message_handler(int header, CMNonCMHandler handler)
 {
     if (foreign_handler_count > 0) {
	 foreign_handler_list = INT_CMrealloc(foreign_handler_list, 
					  sizeof(foreign_handler_list[0]) * 
					  (foreign_handler_count + 1));
     } else {
	 foreign_handler_list = INT_CMmalloc(sizeof(foreign_handler_list[0]));
/*	 atexit(clear_foreign_handlers);*/
     }
     foreign_handler_list[foreign_handler_count].header = header;
     foreign_handler_list[foreign_handler_count].handler = handler;
     foreign_handler_count++;
 }